

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_init_from_file__internal
                    (ma_decoding_backend_vtable *pVTable,void *pVTableUserData,char *pFilePath,
                    ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  ma_data_source *pBackend;
  ma_decoding_backend_config backendConfig;
  ma_result result;
  ma_uint32 in_stack_ffffffffffffffa8;
  ma_format in_stack_ffffffffffffffac;
  undefined8 local_48;
  ma_decoding_backend_config local_3c;
  long local_30;
  long local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  ma_result local_4;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_3c = ma_decoding_backend_config_init(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    local_4 = (**(code **)(local_10 + 8))(local_18,local_20,&local_3c,local_30 + 0x1f0,&local_48);
    if (local_4 == MA_SUCCESS) {
      *(undefined8 *)(local_30 + 0x48) = local_48;
      *(long *)(local_30 + 0x50) = local_10;
      *(undefined8 *)(local_30 + 0x58) = *(undefined8 *)(local_28 + 0x88);
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_decoder_init_from_file__internal(const ma_decoding_backend_vtable* pVTable, void* pVTableUserData, const char* pFilePath, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoding_backend_config backendConfig;
    ma_data_source* pBackend;

    MA_ASSERT(pVTable  != NULL);
    MA_ASSERT(pConfig  != NULL);
    MA_ASSERT(pDecoder != NULL);

    if (pVTable->onInitFile == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    backendConfig = ma_decoding_backend_config_init(pConfig->format, pConfig->seekPointCount);

    result = pVTable->onInitFile(pVTableUserData, pFilePath, &backendConfig, &pDecoder->allocationCallbacks, &pBackend);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to initialize the backend from this vtable. */
    }

    /* Getting here means we were able to initialize the backend so we can now initialize the decoder. */
    pDecoder->pBackend         = pBackend;
    pDecoder->pBackendVTable   = pVTable;
    pDecoder->pBackendUserData = pConfig->pCustomBackendUserData;

    return MA_SUCCESS;
}